

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void update_ref_frame_id(AV1Decoder *pbi)

{
  int iVar1;
  int i;
  int refresh_frame_flags;
  AV1_COMMON *cm;
  AV1Decoder *pbi_local;
  
  iVar1 = (pbi->common).current_frame.refresh_frame_flags;
  for (i = 0; i < 8; i = i + 1) {
    if ((iVar1 >> ((byte)i & 0x1f) & 1U) != 0) {
      (pbi->common).ref_frame_id[i] = (pbi->common).current_frame_id;
      pbi->valid_for_referencing[i] = 1;
    }
  }
  return;
}

Assistant:

static inline void update_ref_frame_id(AV1Decoder *const pbi) {
  AV1_COMMON *const cm = &pbi->common;
  int refresh_frame_flags = cm->current_frame.refresh_frame_flags;
  for (int i = 0; i < REF_FRAMES; i++) {
    if ((refresh_frame_flags >> i) & 1) {
      cm->ref_frame_id[i] = cm->current_frame_id;
      pbi->valid_for_referencing[i] = 1;
    }
  }
}